

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::skipMacroTokensBeforeProtectRegion
          (Preprocessor *this,Token directive,SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  Diagnostic *this_00;
  iterator pTVar1;
  Preprocessor *in_RDI;
  SourceRange SVar2;
  SourceRange SVar3;
  iterator in_stack_ffffffffffffff98;
  SourceRange in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  DiagCode in_stack_ffffffffffffffc4;
  undefined4 uVar4;
  SourceLocation SVar5;
  DiagCode noteCode;
  
  if (in_RDI->currentMacroToken != (Token *)0x0) {
    SVar2 = Token::range((Token *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    SVar5 = SVar2.startLoc;
    noteCode = SVar2.endLoc._4_4_;
    this_00 = addDiag(in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb0);
    uVar4 = 0x1c0004;
    SVar3 = Token::range((Token *)CONCAT44(0x1c0004,in_stack_ffffffffffffffc0));
    SVar2.startLoc._4_4_ = uVar4;
    SVar2.startLoc._0_4_ = in_stack_ffffffffffffffc0;
    SVar2.endLoc = SVar5;
    Diagnostic::addNote((Diagnostic *)SVar3.endLoc,noteCode,SVar2);
    do {
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)this_00,in_stack_ffffffffffffff98);
      in_RDI->currentMacroToken = in_RDI->currentMacroToken + 1;
      in_stack_ffffffffffffff98 = in_RDI->currentMacroToken;
      pTVar1 = SmallVectorBase<slang::parsing::Token>::end
                         (&(in_RDI->expandedTokens).super_SmallVectorBase<slang::parsing::Token>);
    } while (in_stack_ffffffffffffff98 != pTVar1);
    in_RDI->currentMacroToken = (Token *)0x0;
    SmallVectorBase<slang::parsing::Token>::clear((SmallVectorBase<slang::parsing::Token> *)this_00)
    ;
  }
  return;
}

Assistant:

void Preprocessor::skipMacroTokensBeforeProtectRegion(Token directive,
                                                      SmallVectorBase<Token>& skippedTokens) {
    // We're about to lex an encoded / encrypted data block based on a pragma
    // protect directive, so we don't expect there to be macro tokens still pending.
    // If there are, issue an error and skip them.
    SLANG_ASSERT(!currentToken);
    if (currentMacroToken) {
        addDiag(diag::MacroTokensAfterPragmaProtect, currentMacroToken->range())
            .addNote(diag::NoteDirectiveHere, directive.range());

        do {
            skippedTokens.push_back(*currentMacroToken);
            currentMacroToken++;
        } while (currentMacroToken != expandedTokens.end());

        currentMacroToken = nullptr;
        expandedTokens.clear();
    }
}